

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RedundantSetElimination.cpp
# Opt level: O1

void wasm::anon_unknown_101::RedundantSetElimination::doVisitLocalSet
               (RedundantSetElimination *self,Expression **currp)

{
  pointer *ppppEVar1;
  BasicBlock *pBVar2;
  iterator __position;
  Expression **local_10;
  Expression **currp_local;
  
  pBVar2 = (self->
           super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>_>
           ).
           super_CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
           .currBasicBlock;
  if (pBVar2 != (BasicBlock *)0x0) {
    __position._M_current =
         (pBVar2->contents).items.
         super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pBVar2->contents).items.
        super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_10 = currp;
      std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>::
      _M_realloc_insert<wasm::Expression**const&>
                ((vector<wasm::Expression**,std::allocator<wasm::Expression**>> *)
                 &(pBVar2->contents).items,__position,&local_10);
    }
    else {
      *__position._M_current = currp;
      ppppEVar1 = &(pBVar2->contents).items.
                   super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      *ppppEVar1 = *ppppEVar1 + 1;
    }
  }
  return;
}

Assistant:

static void doVisitLocalSet(RedundantSetElimination* self,
                              Expression** currp) {
    if (self->currBasicBlock) {
      self->currBasicBlock->contents.items.push_back(currp);
    }
  }